

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

bool __thiscall
ProjectBuilderMakefileGenerator::replaceLibrarySuffix
          (ProjectBuilderMakefileGenerator *this,QString *lib_file,ProString *opt,QString *name,
          QString *library)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  qsizetype qVar6;
  long lVar7;
  QString *pQVar8;
  ulong uVar9;
  QString *in_RCX;
  QString *in_R8;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char> QVar10;
  int pos_1;
  int pos;
  QString librarySuffix;
  QString suffixSetting;
  QString libDir;
  QMakeMetaInfo libinfo;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  ProString *in_stack_fffffffffffffc00;
  CaseSensitivity cs;
  QMakeProject *in_stack_fffffffffffffc08;
  ProKey *in_stack_fffffffffffffc10;
  QMakeEvaluator *in_stack_fffffffffffffc18;
  QString *in_stack_fffffffffffffc20;
  QString *in_stack_fffffffffffffc28;
  MakefileGenerator *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  bool local_389;
  bool local_341;
  QString local_240 [5];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  QStringBuilder<const_QString_&,_QString_&> local_f0;
  QFileInfo local_70 [8];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_20;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x136c21);
  if (bVar1) {
    local_341 = false;
  }
  else {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QMakeMetaInfo::QMakeMetaInfo((QMakeMetaInfo *)0x136c50);
    bVar1 = QMakeMetaInfo::readLib
                      ((QMakeMetaInfo *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_389 = true;
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffc00,
                     (char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      local_389 = QMakeMetaInfo::isEmpty
                            ((QMakeMetaInfo *)in_stack_fffffffffffffc10,
                             (ProKey *)in_stack_fffffffffffffc08);
      ProKey::~ProKey((ProKey *)0x136cd2);
    }
    if (local_389 == false) {
      local_68 = 0xaaaaaaaaaaaaaaaa;
      local_60 = 0xaaaaaaaaaaaaaaaa;
      local_58 = 0xaaaaaaaaaaaaaaaa;
      QString::QString(&in_stack_fffffffffffffc00->m_string,
                       (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      MakefileGenerator::fileInfo(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      QFileInfo::absolutePath();
      QFileInfo::~QFileInfo(local_70);
      QString::~QString((QString *)0x136d82);
      local_f0 = ::operator+(&in_stack_fffffffffffffc00->m_string,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffc00,
                     (char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      QMakeMetaInfo::first((QMakeMetaInfo *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      ::operator+((QStringBuilder<const_QString_&,_QString_&> *)in_stack_fffffffffffffc08,
                  in_stack_fffffffffffffc00);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      QString::operator=(&in_stack_fffffffffffffc00->m_string,
                         (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      QString::~QString((QString *)0x136e2b);
      QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString> *)0x136e38);
      ProString::~ProString((ProString *)0x136e45);
      ProKey::~ProKey((ProKey *)0x136e52);
      if (Option::debug_level != 0) {
        ProString::toLatin1((ProString *)in_stack_fffffffffffffc18);
        pcVar3 = QByteArray::constData((QByteArray *)0x136e84);
        QString::toLatin1((QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        pcVar4 = QByteArray::constData((QByteArray *)0x136eab);
        QString::toLatin1((QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        pcVar5 = QByteArray::constData((QByteArray *)0x136ed2);
        debug_msg_internal(1,"pbuilder: Found library (%s) via PRL %s (%s)",pcVar3,pcVar4,pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x136eff);
        QByteArray::~QByteArray((QByteArray *)0x136f0c);
        QByteArray::~QByteArray((QByteArray *)0x136f19);
      }
      QString::QString((QString *)in_stack_fffffffffffffc08,
                       (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      bVar1 = QMakeProject::isActiveConfig
                        (in_stack_fffffffffffffc08,&in_stack_fffffffffffffc00->m_string,
                         (bool)in_stack_fffffffffffffbff);
      QString::~QString((QString *)0x136f66);
      if (bVar1) {
        local_1c8 = 0xaaaaaaaaaaaaaaaa;
        local_1c0 = 0xaaaaaaaaaaaaaaaa;
        local_1b8 = 0xaaaaaaaaaaaaaaaa;
        ProKey::ProKey((ProKey *)in_stack_fffffffffffffc00,
                       (char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        QMakeEvaluator::first(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
        ProString::toQString
                  ((ProString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        ProString::~ProString((ProString *)0x137004);
        ProKey::~ProKey((ProKey *)0x137011);
        bVar1 = QString::isEmpty((QString *)0x13701e);
        if (!bVar1) {
          local_240[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_240[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_240[0].d.size = -0x5555555555555556;
          ProKey::ProKey((ProKey *)in_stack_fffffffffffffc00,
                         (char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          QMakeEvaluator::first(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
          ProString::toQString
                    ((ProString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          ProString::~ProString((ProString *)0x1370b7);
          ProKey::~ProKey((ProKey *)0x1370c4);
          ::operator+((char (*) [3])in_stack_fffffffffffffc00,
                      (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          ::operator+((QStringBuilder<const_char_(&)[3],_QString_&> *)in_stack_fffffffffffffc00,
                      (char (*) [2])CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>
                      *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          QString::operator=(&in_stack_fffffffffffffc00->m_string,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          QString::~QString((QString *)0x13713b);
          bVar1 = QString::isEmpty((QString *)0x137148);
          if (bVar1) {
            qVar6 = QString::lastIndexOf
                              ((QString *)in_stack_fffffffffffffc10,
                               (QString *)in_stack_fffffffffffffc08,
                               (CaseSensitivity)((ulong)in_stack_fffffffffffffc00 >> 0x20));
            if ((int)qVar6 != -1) {
              QString::size(in_RCX);
              QString::insert(in_stack_fffffffffffffc20,(qsizetype)in_stack_fffffffffffffc18,
                              (QString *)in_stack_fffffffffffffc10);
            }
          }
          else {
            QVar10 = ::operator+((QString *)in_stack_fffffffffffffc08,
                                 (char *)in_stack_fffffffffffffc00);
            cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffc00 >> 0x20);
            local_18 = QVar10.a;
            local_10 = QVar10.b;
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QString_&,_char> *)
                       CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            qVar6 = QString::lastIndexOf
                              ((QString *)in_stack_fffffffffffffc10,
                               (QString *)in_stack_fffffffffffffc08,cs);
            iVar2 = (int)qVar6;
            QString::~QString((QString *)0x1371e4);
            if (iVar2 == -1) {
              QtPrivate::asString(local_240);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffffc18);
              pcVar3 = QByteArray::constData((QByteArray *)0x137227);
              QtPrivate::asString(in_R8);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffffc18);
              pcVar4 = QByteArray::constData((QByteArray *)0x137256);
              warn_msg(WarnLogic,"Failed to find expected suffix \'%s\' for library \'%s\'.",pcVar3,
                       pcVar4);
              QByteArray::~QByteArray((QByteArray *)0x13727e);
              QByteArray::~QByteArray((QByteArray *)0x13728b);
            }
            else {
              lVar7 = (long)iVar2;
              pQVar8 = (QString *)QString::size(local_240);
              QString::replace((longlong)in_R8,lVar7,pQVar8);
              uVar9 = QString::endsWith((QString *)in_RCX,(CaseSensitivity)local_240);
              if ((uVar9 & 1) != 0) {
                QString::size(local_240);
                QString::chop((longlong)in_RCX);
              }
            }
          }
          QString::~QString((QString *)0x137397);
        }
        QString::~QString((QString *)0x1373a4);
      }
      local_341 = true;
      QString::~QString((QString *)0x1373c4);
    }
    else {
      local_341 = false;
    }
    QMakeMetaInfo::~QMakeMetaInfo((QMakeMetaInfo *)0x1373d1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_341;
  }
  __stack_chk_fail();
}

Assistant:

bool ProjectBuilderMakefileGenerator::replaceLibrarySuffix(const QString &lib_file,
                                                           const ProString &opt,
                                                           QString &name, QString &library)
{
    /* This isn't real nice, but it is real useful. This looks in a prl
       for what the library will ultimately be called so we can stick it
       in the ProjectFile. If the prl format ever changes (not likely) then
       this will not really work. However, more concerning is that it will
       encode the version number in the Project file which might be a bad
       things in days to come? --Sam
    */
    if (lib_file.isEmpty())
        return false;

    QMakeMetaInfo libinfo;
    if (!libinfo.readLib(lib_file) || libinfo.isEmpty("QMAKE_PRL_TARGET"))
        return false;

    const QString libDir = fileInfo(lib_file).absolutePath();
    library = libDir + Option::dir_sep + libinfo.first("QMAKE_PRL_TARGET");

    debug_msg(1, "pbuilder: Found library (%s) via PRL %s (%s)",
              opt.toLatin1().constData(), lib_file.toLatin1().constData(), library.toLatin1().constData());

    if (project->isActiveConfig("xcode_dynamic_library_suffix")) {
        QString suffixSetting = project->first("QMAKE_XCODE_LIBRARY_SUFFIX_SETTING").toQString();
        if (!suffixSetting.isEmpty()) {
            QString librarySuffix = project->first("QMAKE_XCODE_LIBRARY_SUFFIX").toQString();
            suffixSetting = "$(" + suffixSetting + ")";
            if (!librarySuffix.isEmpty()) {
                int pos = library.lastIndexOf(librarySuffix + '.');
                if (pos == -1) {
                    warn_msg(WarnLogic, "Failed to find expected suffix '%s' for library '%s'.",
                             qPrintable(librarySuffix), qPrintable(library));
                } else {
                    library.replace(pos, librarySuffix.size(), suffixSetting);
                    if (name.endsWith(librarySuffix))
                        name.chop(librarySuffix.size());
                }
            } else {
                int pos = library.lastIndexOf(name);
                if (pos != -1)
                    library.insert(pos + name.size(), suffixSetting);
            }
        }
    }

    return true;
}